

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  
  iVar1 = this->tags_size_;
  uVar2 = this->tags_count_;
  bVar4 = true;
  if (iVar1 <= (int)uVar2) {
    iVar5 = 1;
    if (iVar1 != 0) {
      iVar5 = iVar1 * 2;
    }
    __n = (long)iVar5 * 0x10;
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar8 = __n + 8;
    }
    plVar6 = (long *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    uVar8 = 0;
    if (plVar6 == (long *)0x0) {
      bVar4 = false;
    }
    else {
      *plVar6 = (long)iVar5;
      memset((Tag *)(plVar6 + 1),0,__n);
      pTVar3 = this->tags_;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
        *(undefined8 *)((long)plVar6 + uVar8 + 8) =
             *(undefined8 *)((long)&pTVar3->simple_tags_ + uVar8);
        *(undefined8 *)((long)plVar6 + uVar8 + 0x10) =
             *(undefined8 *)((long)&pTVar3->simple_tags_size_ + uVar8);
      }
      if (pTVar3 != (Tag *)0x0) {
        operator_delete__(&pTVar3[-1].simple_tags_size_);
      }
      this->tags_ = (Tag *)(plVar6 + 1);
      this->tags_size_ = iVar5;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}